

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteUInt64
               (int field_number,uint64 value,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  byte *pbVar8;
  
  uVar7 = field_number << 3;
  if ((output->impl_).end_ <= output->cur_) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar4;
  }
  pbVar8 = output->cur_;
  if (uVar7 < 0x80) {
    *pbVar8 = (byte)uVar7;
    pbVar8 = pbVar8 + 1;
  }
  else {
    *pbVar8 = (byte)uVar7 | 0x80;
    if (uVar7 < 0x4000) {
      pbVar8[1] = (byte)(uVar7 >> 7);
      pbVar8 = pbVar8 + 2;
    }
    else {
      pbVar8 = pbVar8 + 2;
      uVar7 = uVar7 >> 7;
      do {
        pbVar3 = pbVar8;
        pbVar3[-1] = (byte)uVar7 | 0x80;
        uVar2 = uVar7 >> 7;
        pbVar8 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar2;
      } while (bVar1);
      *pbVar3 = (byte)uVar2;
    }
  }
  output->cur_ = pbVar8;
  if ((output->impl_).end_ <= pbVar8) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar8);
    output->cur_ = puVar4;
  }
  pbVar8 = output->cur_;
  if (value < 0x80) {
    *pbVar8 = (byte)value;
    pbVar8 = pbVar8 + 1;
  }
  else {
    *pbVar8 = (byte)value | 0x80;
    if (value < 0x4000) {
      pbVar8[1] = (byte)(value >> 7);
      pbVar8 = pbVar8 + 2;
    }
    else {
      pbVar8 = pbVar8 + 2;
      uVar5 = value >> 7;
      do {
        pbVar3 = pbVar8;
        pbVar3[-1] = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar8 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar1);
      *pbVar3 = (byte)uVar6;
    }
  }
  output->cur_ = pbVar8;
  return;
}

Assistant:

void WireFormatLite::WriteUInt64(int field_number, uint64 value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteUInt64NoTag(value, output);
}